

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterDup.cpp
# Opt level: O0

bool __thiscall liblogger::LogFilterDup::Filter(LogFilterDup *this,LogType Type,string *str)

{
  __type _Var1;
  ostream *poVar2;
  string *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  exception *ex;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  string *in_stack_fffffffffffffe68;
  LogType in_stack_fffffffffffffe74;
  bool local_1;
  
  if ((in_RDI->_M_string_length & 1) == 0) {
    *(undefined1 *)&in_RDI->_M_string_length = 1;
    if ((in_ESI == *(int *)&in_RDI[1].field_2) &&
       (_Var1 = std::operator==(in_stack_fffffffffffffe20,in_RDI), _Var1)) {
      *(int *)((long)&in_RDI[1].field_2 + 4) = *(int *)((long)&in_RDI[1].field_2 + 4) + 1;
      *(undefined1 *)&in_RDI->_M_string_length = 0;
      local_1 = true;
    }
    else {
      if (*(int *)((long)&in_RDI[1].field_2 + 4) != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe68,"Last message repeated ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)&in_RDI[1].field_2 + 4));
        std::operator<<(poVar2," times");
        std::__cxx11::stringstream::str();
        LogManager::Send(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream(local_1a8);
      }
      *(undefined4 *)((long)&in_RDI[1].field_2 + 4) = 0;
      std::__cxx11::string::operator=((string *)(in_RDI->field_2)._M_local_buf,in_RDX);
      *(int *)&in_RDI[1].field_2 = in_ESI;
      *(undefined1 *)&in_RDI->_M_string_length = 0;
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LogFilterDup::Filter(const LogType Type, const std::string &str)
{
	if (m_busy)
		return false; //Being reentered
	m_busy = true;
	try
	{
		if (Type == m_lasttype && str == m_last)
		{
			m_matched++;
			m_busy = false;
			return true;
		}
	
		if (m_matched)
		{
			std::stringstream ss;
			ss << "Last message repeated " << m_matched << " times";
			LogManager::Send(m_lasttype, ss.str());
		}
		m_matched = 0;
		m_last = str;
		m_lasttype = Type;
		m_busy = false;
		return false;
	}
	catch(std::exception &ex)
	{
		m_busy = false;
		throw(ex);
	}
}